

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_test.cpp
# Opt level: O1

void unary_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>
               (rt_binary_expr<viennamath::rt_expression_interface<double>_> *e)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  double __x;
  double dVar2;
  double __x_00;
  double __x_01;
  double __x_02;
  double extraout_XMM0_Qa;
  double __x_03;
  double __x_04;
  double __x_05;
  vector<double,_std::allocator<double>_> p;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_150;
  undefined8 *local_138;
  undefined8 *puStack_130;
  undefined8 *local_128;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_120;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_100;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_e0;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_c0;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_a0;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_80;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_60;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_40;
  
  local_138 = (undefined8 *)0x0;
  puStack_130 = (undefined8 *)0x0;
  local_128 = (undefined8 *)0x0;
  local_138 = (undefined8 *)operator_new(0x18);
  puStack_130 = local_138 + 3;
  *local_138 = 0;
  local_138[1] = 0;
  local_138[2] = 0;
  *local_138 = 0x4010000000000000;
  local_138[1] = 0x4018000000000000;
  local_138[2] = 0x4020000000000000;
  local_128 = puStack_130;
  iVar1 = (*(e->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(e);
  local_150.op_._M_ptr =
       (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
  (local_150.op_._M_ptr)->_vptr_op_interface = (_func_int **)&PTR__op_interface_00130d20;
  local_150.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_001302e0;
  local_150.expr_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar1);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_40,e);
  (*local_40.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])
            (&local_40,&local_138);
  dVar2 = exp(__x);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_150,dVar2);
  local_40.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  if (local_40.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_40.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_40.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_40.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_40.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_40.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_150.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_001302e0;
  if (local_150.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_150.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_150.expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_150.expr_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  iVar1 = (*(e->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(e);
  local_150.op_._M_ptr =
       (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
  (local_150.op_._M_ptr)->_vptr_op_interface = (_func_int **)&PTR__op_interface_00130860;
  local_150.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_001302e0;
  local_150.expr_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_00,iVar1);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_60,e);
  (*local_60.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])
            (&local_60,&local_138);
  dVar2 = sin(__x_00);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_150,dVar2);
  local_60.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  if (local_60.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_60.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_60.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_60.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_60.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_60.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_150.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_001302e0;
  if (local_150.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_150.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_150.expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_150.expr_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  iVar1 = (*(e->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(e);
  local_150.op_._M_ptr =
       (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
  (local_150.op_._M_ptr)->_vptr_op_interface = (_func_int **)&PTR__op_interface_001308f0;
  local_150.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_001302e0;
  local_150.expr_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_01,iVar1);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_80,e);
  (*local_80.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])
            (&local_80,&local_138);
  dVar2 = cos(__x_01);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_150,dVar2);
  local_80.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  if (local_80.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_80.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_80.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_80.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_80.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_80.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_150.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_001302e0;
  if (local_150.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_150.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_150.expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_150.expr_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  iVar1 = (*(e->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(e);
  local_150.op_._M_ptr =
       (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
  (local_150.op_._M_ptr)->_vptr_op_interface = (_func_int **)&PTR__op_interface_00130980;
  local_150.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_001302e0;
  local_150.expr_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_02,iVar1);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_a0,e);
  (*local_a0.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])
            (&local_a0,&local_138);
  dVar2 = tan(__x_02);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_150,dVar2);
  local_a0.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  if (local_a0.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_a0.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_a0.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_a0.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_a0.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_a0.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_150.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_001302e0;
  if (local_150.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_150.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_150.expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_150.expr_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  iVar1 = (*(e->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(e);
  local_150.op_._M_ptr =
       (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
  (local_150.op_._M_ptr)->_vptr_op_interface = (_func_int **)&PTR__op_interface_00130a10;
  local_150.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_001302e0;
  local_150.expr_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_03,iVar1);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_c0,e);
  (*local_c0.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])
            (&local_c0,&local_138);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_150,ABS(extraout_XMM0_Qa));
  local_c0.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  if (local_c0.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_c0.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_c0.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_c0.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_c0.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_c0.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_150.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_001302e0;
  if (local_150.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_150.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_150.expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_150.expr_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  iVar1 = (*(e->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(e);
  local_150.op_._M_ptr =
       (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
  (local_150.op_._M_ptr)->_vptr_op_interface = (_func_int **)&PTR__op_interface_00130ae0;
  local_150.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_001302e0;
  local_150.expr_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_04,iVar1);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_e0,e);
  (*local_e0.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])
            (&local_e0,&local_138);
  if (__x_03 < 0.0) {
    dVar2 = sqrt(__x_03);
  }
  else {
    dVar2 = SQRT(__x_03);
  }
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_150,dVar2);
  local_e0.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  if (local_e0.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_e0.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_e0.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_e0.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_e0.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_e0.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_150.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_001302e0;
  if (local_150.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_150.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_150.expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_150.expr_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  iVar1 = (*(e->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(e);
  local_150.op_._M_ptr =
       (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
  (local_150.op_._M_ptr)->_vptr_op_interface = (_func_int **)&PTR__op_interface_00130b70;
  local_150.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_001302e0;
  local_150.expr_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_05,iVar1);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_100,e);
  (*local_100.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])
            (&local_100,&local_138);
  dVar2 = log(__x_04);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_150,dVar2);
  local_100.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  if (local_100.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_100.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_100.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_100.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_100.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_100.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_150.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_001302e0;
  if (local_150.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_150.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_150.expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_150.expr_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  iVar1 = (*(e->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(e);
  local_150.op_._M_ptr =
       (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
  (local_150.op_._M_ptr)->_vptr_op_interface = (_func_int **)&PTR__op_interface_00130c90;
  local_150.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_001302e0;
  local_150.expr_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_06,iVar1);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_120,e);
  (*local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])
            (&local_120,&local_138);
  dVar2 = log10(__x_05);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_150,dVar2);
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  if (local_120.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_120.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_120.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_120.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_120.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_120.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_150.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_001302e0;
  if (local_150.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_150.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_150.expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_150.expr_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_138 != (undefined8 *)0x0) {
    operator_delete(local_138,(long)local_128 - (long)local_138);
  }
  return;
}

Assistant:

void unary_test(E const & e)
{
  std::vector<double> p(3);
  p[0] = 4;
  p[1] = 6;
  p[2] = 8;

  unary_test(viennamath::exp(e),   exp(viennamath::eval(e,p)) );
  unary_test(viennamath::sin(e),   sin(viennamath::eval(e,p)) );
  unary_test(viennamath::cos(e),   cos(viennamath::eval(e,p)) );
  unary_test(viennamath::tan(e),   tan(viennamath::eval(e,p)) );
  unary_test(viennamath::fabs(e),  fabs(viennamath::eval(e,p)) );
  unary_test(viennamath::sqrt(e),  sqrt(viennamath::eval(e,p)) );
  unary_test(viennamath::log(e),   log(viennamath::eval(e,p)) );
  unary_test(viennamath::log10(e), log10(viennamath::eval(e,p)) );
}